

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestBranchInternal2::Run(TestBranchInternal2 *this)

{
  Outputter *pOVar1;
  stack<testinator::Branch_*,_std::deque<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>_>
  *psVar2;
  _Elt_pointer ppBVar3;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  *t;
  AtScopeExit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_elbeno[P]testinator_src_test_main_cpp:448:5)>
  rspop448;
  BranchScope rs448;
  AtScopeExit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_elbeno[P]testinator_src_test_main_cpp:448:5)>
  local_61;
  BranchScope local_60;
  string local_48;
  testinator local_28 [8];
  char *local_20;
  string *local_18;
  
  testinator::BranchScope::BranchScope
            (&local_60,0x1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp"
             ,"");
  if (local_60.m_canRun == true) {
    pOVar1 = (this->super_Test).m_op;
    psVar2 = testinator::Branch::getStack();
    ppBVar3 = (psVar2->c).
              super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    if (ppBVar3 ==
        (psVar2->c).super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppBVar3 = (psVar2->c).
                super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_18 = &ppBVar3[-1]->m_name;
    local_20 = "branch ";
    testinator::
    Diagnostic<testinator::Cons<std::pair<std::pair<testinator::Nil,char_const*>,std::__cxx11::string_const&>>>
              (&local_48,local_28,t);
    (*pOVar1->_vptr_Outputter[3])(pOVar1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    testinator::
    AtScopeExit<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:448:5)>
    ::~AtScopeExit(&local_61);
  }
  (local_60.m_parent)->m_complete =
       (bool)((local_60.m_parent)->m_complete & (local_60.m_child)->m_complete);
  (local_60.m_parent)->m_canRunChild = true;
  return true;
}

Assistant:

virtual bool Run()
  {
    BRANCH()
    {
      DIAGNOSTIC("branch " << BRANCH_NAME);
    }

    return true;
  }